

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

void __thiscall
Guild_Create::Guild_Create
          (Guild_Create *this,GuildManager *manager,string *tag,string *name,Character *leader)

{
  string local_80;
  string local_50;
  Character *local_30;
  Character *leader_local;
  string *name_local;
  string *tag_local;
  GuildManager *manager_local;
  Guild_Create *this_local;
  
  local_30 = leader;
  leader_local = (Character *)name;
  name_local = tag;
  tag_local = (string *)manager;
  manager_local = (GuildManager *)this;
  std::enable_shared_from_this<Guild_Create>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Guild_Create>);
  std::__cxx11::string::string((string *)&this->tag);
  std::__cxx11::string::string((string *)&this->name);
  std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>::
  vector(&this->members);
  util::uppercase(&local_50,tag);
  std::__cxx11::string::operator=((string *)tag,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->manager = (GuildManager *)tag_local;
  std::__cxx11::string::operator=((string *)&this->tag,(string *)tag);
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->leader = local_30;
  std::__cxx11::string::string((string *)&local_80,(string *)&local_30->real_name);
  AddMember(this,&local_80,0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

Guild_Create::Guild_Create(GuildManager *manager, std::string tag, std::string name, Character *leader)
{
	tag = util::uppercase(tag);

	this->manager = manager;
	this->tag = tag;
	this->name = name;
	this->leader = leader;

	this->AddMember(leader->real_name, 0);
}